

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O3

string * __thiscall
kratos::Sequence::to_string
          (string *__return_storage_ptr__,Sequence *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*)>
          *var_str)

{
  Sequence *this_00;
  pointer pcVar1;
  undefined8 uVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined1 auStack_b8 [8];
  string wait_str;
  pointer local_88;
  pointer pcStack_80;
  undefined1 auStack_70 [8];
  string next;
  pointer pcStack_48;
  pointer local_40;
  
  wait_to_str_abi_cxx11_((string *)auStack_b8,this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (wait_str._M_dataplus._M_p == (pointer)0x0) {
    (*(this->var_->super_IRNode)._vptr_IRNode[0x21])
              ((undefined1 *)((long)&wait_str.field_2 + 8),this->var_,1);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)(wait_str.field_2._M_local_buf + 8));
    pcVar1 = local_88;
    uVar2 = wait_str.field_2._8_8_;
    if ((pointer *)wait_str.field_2._8_8_ == &local_88) goto LAB_001cce57;
  }
  else {
    wait_str.field_2._8_8_ = this->var_;
    if ((var_str->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*var_str->_M_invoker)
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&next.field_2 + 8),(_Any_data *)var_str,(Var **)((long)&wait_str.field_2 + 8))
    ;
    wait_str.field_2._8_8_ = auStack_b8;
    local_88 = (pointer)next.field_2._8_8_;
    pcStack_80 = pcStack_48;
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x7;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)((long)&wait_str.field_2 + 8);
    fmt::v7::detail::vformat_abi_cxx11_((string *)auStack_70,(detail *)"{0} {1}",format_str,args);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)auStack_70);
    if (auStack_70 != (undefined1  [8])&next._M_string_length) {
      operator_delete((void *)auStack_70,next._M_string_length + 1);
    }
    pcVar1 = local_40;
    uVar2 = next.field_2._8_8_;
    if ((pointer *)next.field_2._8_8_ == &stack0xffffffffffffffc0) goto LAB_001cce57;
  }
  operator_delete((void *)uVar2,(ulong)(pcVar1 + 1));
LAB_001cce57:
  this_00 = (this->next_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (Sequence *)0x0) {
    to_string_abi_cxx11_((string *)auStack_70,this_00);
    wait_str.field_2._8_8_ = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_88 = (pointer)auStack_70;
    pcStack_80 = next._M_dataplus._M_p;
    format_str_00.size_ = 0xdd;
    format_str_00.data_ = (char *)0xb;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)((long)&wait_str.field_2 + 8);
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&next.field_2 + 8),(detail *)"{0} |-> {1}",format_str_00,args_00);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)(next.field_2._M_local_buf + 8));
    if ((pointer *)next.field_2._8_8_ != &stack0xffffffffffffffc0) {
      operator_delete((void *)next.field_2._8_8_,(ulong)(local_40 + 1));
    }
    if (auStack_70 != (undefined1  [8])&next._M_string_length) {
      operator_delete((void *)auStack_70,next._M_string_length + 1);
    }
  }
  if (auStack_b8 != (undefined1  [8])&wait_str._M_string_length) {
    operator_delete((void *)auStack_b8,wait_str._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Sequence::to_string(const std::function<std::string(Var *)> &var_str) const {
    auto wait_str = wait_to_str();
    std::string seq;
    if (wait_str.empty())
        seq = var_->handle_name(true);
    else
        seq = ::format("{0} {1}", wait_str, var_str(var_));
    if (next_) {
        auto next = next_->to_string();
        seq = ::format("{0} |-> {1}", seq, next);
    }
    return seq;
}